

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O2

void __thiscall ipx::Iterate::ComputeComplementarity(Iterate *this)

{
  double *pdVar1;
  pointer pSVar2;
  double *pdVar3;
  double dVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  Int j;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  uVar5 = this->model_->num_cols_ + this->model_->num_rows_;
  pdVar1 = (this->xl_)._M_data;
  this->complementarity_ = 0.0;
  this->mu_min_ = INFINITY;
  this->mu_max_ = 0.0;
  pSVar2 = (this->variable_state_).
           super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar3 = (this->zl_)._M_data;
  uVar8 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar8;
  }
  dVar11 = INFINITY;
  dVar10 = 0.0;
  dVar9 = 0.0;
  iVar7 = 0;
  for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    if ((pSVar2[uVar8] & ~BARRIER_BOXED) == BARRIER_LB) {
      dVar9 = dVar9 + pdVar1[uVar8] * pdVar3[uVar8];
      this->complementarity_ = dVar9;
      dVar4 = pdVar1[uVar8] * pdVar3[uVar8];
      if (dVar11 <= pdVar1[uVar8] * pdVar3[uVar8]) {
        dVar4 = dVar11;
      }
      dVar11 = dVar4;
      this->mu_min_ = dVar11;
      dVar4 = pdVar1[uVar8] * pdVar3[uVar8];
      if (pdVar1[uVar8] * pdVar3[uVar8] <= dVar10) {
        dVar4 = dVar10;
      }
      dVar10 = dVar4;
      this->mu_max_ = dVar10;
      iVar7 = iVar7 + 1;
    }
  }
  pdVar1 = (this->xu_)._M_data;
  pdVar3 = (this->zu_)._M_data;
  for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    if (pSVar2[uVar8] - BARRIER_UB < 2) {
      dVar9 = dVar9 + pdVar1[uVar8] * pdVar3[uVar8];
      this->complementarity_ = dVar9;
      dVar4 = pdVar1[uVar8] * pdVar3[uVar8];
      if (dVar11 <= pdVar1[uVar8] * pdVar3[uVar8]) {
        dVar4 = dVar11;
      }
      dVar11 = dVar4;
      this->mu_min_ = dVar11;
      dVar4 = pdVar1[uVar8] * pdVar3[uVar8];
      if (pdVar1[uVar8] * pdVar3[uVar8] <= dVar10) {
        dVar4 = dVar10;
      }
      dVar10 = dVar4;
      this->mu_max_ = dVar10;
      iVar7 = iVar7 + 1;
    }
  }
  if (iVar7 < 1) {
    this->mu_min_ = 0.0;
    dVar9 = 0.0;
  }
  else {
    dVar9 = dVar9 / (double)iVar7;
  }
  this->mu_ = dVar9;
  return;
}

Assistant:

void Iterate::ComputeComplementarity() const {
    const Int m = model_.rows();
    const Int n = model_.cols();

    complementarity_ = 0.0;
    mu_min_ = INFINITY;
    mu_max_ = 0.0;
    Int num_finite = 0;
    for (Int j = 0; j < n+m; j++) {
        if (has_barrier_lb(j)) {
            complementarity_ += xl_[j] * zl_[j];
            mu_min_ = std::min(mu_min_, xl_[j]*zl_[j]);
            mu_max_ = std::max(mu_max_, xl_[j]*zl_[j]);
            num_finite++;
        }
    }
    for (Int j = 0; j < n+m; j++) {
        if (has_barrier_ub(j)) {
            complementarity_ += xu_[j] * zu_[j];
            mu_min_ = std::min(mu_min_, xu_[j]*zu_[j]);
            mu_max_ = std::max(mu_max_, xu_[j]*zu_[j]);
            num_finite++;
        }
    }
    if (num_finite > 0)
        mu_ = complementarity_ / num_finite;
    else
        mu_ = mu_min_ = 0.0;
}